

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

bool __thiscall pbrt::TriangleMesh::WritePLY(TriangleMesh *this,string *filename)

{
  p_ply ply;
  int i;
  long lVar1;
  long lVar2;
  
  ply = ply_create((filename->_M_dataplus)._M_p,PLY_DEFAULT,PlyErrorCallback,0,(void *)0x0);
  if (ply != (p_ply)0x0) {
    ply_add_element(ply,"vertex",(long)this->nVertices);
    ply_add_scalar_property(ply,"x",PLY_FLOAT);
    ply_add_scalar_property(ply,"y",PLY_FLOAT);
    ply_add_scalar_property(ply,"z",PLY_FLOAT);
    if (this->n != (Normal3f *)0x0) {
      ply_add_scalar_property(ply,"nx",PLY_FLOAT);
      ply_add_scalar_property(ply,"ny",PLY_FLOAT);
      ply_add_scalar_property(ply,"nz",PLY_FLOAT);
    }
    if (this->uv != (Point2f *)0x0) {
      ply_add_scalar_property(ply,"u",PLY_FLOAT);
      ply_add_scalar_property(ply,"v",PLY_FLOAT);
    }
    if (this->s != (Vector3f *)0x0) {
      Warning<std::__cxx11::string_const&>
                ("%s: PLY mesh will be missing tangent vectors \"S\".",filename);
    }
    ply_add_element(ply,"face",(long)this->nTriangles);
    ply_add_list_property(ply,"vertex_indices",PLY_UINT8,PLY_INT);
    if (this->faceIndices != (int *)0x0) {
      ply_add_scalar_property(ply,"face_indices",PLY_INT);
    }
    ply_write_header(ply);
    lVar2 = 0;
    for (lVar1 = 0; lVar1 < this->nVertices; lVar1 = lVar1 + 1) {
      ply_write(ply,(double)*(float *)((long)&(this->p->super_Tuple3<pbrt::Point3,_float>).x + lVar2
                                      ));
      ply_write(ply,(double)*(float *)((long)&(this->p->super_Tuple3<pbrt::Point3,_float>).y + lVar2
                                      ));
      ply_write(ply,(double)*(float *)((long)&(this->p->super_Tuple3<pbrt::Point3,_float>).z + lVar2
                                      ));
      if (this->n != (Normal3f *)0x0) {
        ply_write(ply,(double)*(float *)((long)&(this->n->super_Tuple3<pbrt::Normal3,_float>).x +
                                        lVar2));
        ply_write(ply,(double)*(float *)((long)&(this->n->super_Tuple3<pbrt::Normal3,_float>).y +
                                        lVar2));
        ply_write(ply,(double)*(float *)((long)&(this->n->super_Tuple3<pbrt::Normal3,_float>).z +
                                        lVar2));
      }
      if (this->uv != (Point2f *)0x0) {
        ply_write(ply,(double)this->uv[lVar1].super_Tuple2<pbrt::Point2,_float>.x);
        ply_write(ply,(double)this->uv[lVar1].super_Tuple2<pbrt::Point2,_float>.y);
      }
      lVar2 = lVar2 + 0xc;
    }
    lVar2 = 0;
    for (lVar1 = 0; lVar1 < this->nTriangles; lVar1 = lVar1 + 1) {
      ply_write(ply,3.0);
      ply_write(ply,(double)*(int *)((long)this->vertexIndices + lVar2));
      ply_write(ply,(double)*(int *)((long)this->vertexIndices + lVar2 + 4));
      ply_write(ply,(double)*(int *)((long)this->vertexIndices + lVar2 + 8));
      if (this->faceIndices != (int *)0x0) {
        ply_write(ply,(double)this->faceIndices[lVar1]);
      }
      lVar2 = lVar2 + 0xc;
    }
    ply_close(ply);
  }
  return ply != (p_ply)0x0;
}

Assistant:

bool TriangleMesh::WritePLY(const std::string &filename) const {
    p_ply plyFile =
        ply_create(filename.c_str(), PLY_DEFAULT, PlyErrorCallback, 0, nullptr);
    if (plyFile == nullptr)
        return false;

    ply_add_element(plyFile, "vertex", nVertices);
    ply_add_scalar_property(plyFile, "x", PLY_FLOAT);
    ply_add_scalar_property(plyFile, "y", PLY_FLOAT);
    ply_add_scalar_property(plyFile, "z", PLY_FLOAT);
    if (n != nullptr) {
        ply_add_scalar_property(plyFile, "nx", PLY_FLOAT);
        ply_add_scalar_property(plyFile, "ny", PLY_FLOAT);
        ply_add_scalar_property(plyFile, "nz", PLY_FLOAT);
    }
    if (uv != nullptr) {
        ply_add_scalar_property(plyFile, "u", PLY_FLOAT);
        ply_add_scalar_property(plyFile, "v", PLY_FLOAT);
    }
    if (s != nullptr)
        Warning(R"(%s: PLY mesh will be missing tangent vectors "S".)", filename);

    ply_add_element(plyFile, "face", nTriangles);
    ply_add_list_property(plyFile, "vertex_indices", PLY_UINT8, PLY_INT);
    if (faceIndices != nullptr)
        ply_add_scalar_property(plyFile, "face_indices", PLY_INT);

    ply_write_header(plyFile);

    for (int i = 0; i < nVertices; ++i) {
        ply_write(plyFile, p[i].x);
        ply_write(plyFile, p[i].y);
        ply_write(plyFile, p[i].z);
        if (n != nullptr) {
            ply_write(plyFile, n[i].x);
            ply_write(plyFile, n[i].y);
            ply_write(plyFile, n[i].z);
        }
        if (uv != nullptr) {
            ply_write(plyFile, uv[i].x);
            ply_write(plyFile, uv[i].y);
        }
    }

    for (int i = 0; i < nTriangles; ++i) {
        ply_write(plyFile, 3);
        ply_write(plyFile, vertexIndices[3 * i]);
        ply_write(plyFile, vertexIndices[3 * i + 1]);
        ply_write(plyFile, vertexIndices[3 * i + 2]);
        if (faceIndices != nullptr)
            ply_write(plyFile, faceIndices[i]);
    }

    ply_close(plyFile);
    return true;
}